

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall cnn::Min::dim_forward(Min *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  bool bVar1;
  size_type sVar2;
  ostream *this_00;
  invalid_argument *this_01;
  const_reference pvVar3;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  Dim *in_stack_ffffffffffffffa8;
  Dim *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar4;
  ostream *in_stack_ffffffffffffffc0;
  
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar2 == 2) {
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
    bVar1 = cnn::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) {
      pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
      uVar4 = pvVar3->bd;
      pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
      if (uVar4 < pvVar3->bd) {
        pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
      }
      else {
        pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
      }
      memcpy(in_RDI,pvVar3,0x24);
      return in_RDI;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad arguments in Min: ");
  this_00 = cnn::operator<<(in_stack_ffffffffffffffc0,
                            (vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"invalid arguments to Min");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Min::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 || xs[0] != xs[1]) {
    cerr << "Bad arguments in Min: " << xs << endl;
    throw std::invalid_argument("invalid arguments to Min");
  }
  return xs[0].bd >= xs[1].bd ? xs[0] : xs[1];
}